

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O3

string * __thiscall
cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
          (cmRuntimeDependencyArchive *this)

{
  cmMakefile *this_00;
  string *psVar1;
  string local_38;
  
  this_00 = this->Status->Makefile;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL","");
  psVar1 = cmMakefile::GetSafeDefinition(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return psVar1;
}

Assistant:

cmMakefile* cmRuntimeDependencyArchive::GetMakefile() const
{
  return &this->Status.GetMakefile();
}